

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O0

void __thiscall
Win32MakefileGenerator::writeStandardParts(Win32MakefileGenerator *this,QTextStream *t)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  QTextStream *pQVar4;
  ulong uVar5;
  ProStringList *pPVar6;
  QTextStream *pQVar7;
  MakefileGenerator *pMVar8;
  const_iterator cVar9;
  QTextStream *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  ProStringList *val;
  ProStringList *inputs;
  ProStringList *quc;
  ProStringList *forms;
  ProStringList *dlldirs;
  ConstIterator input;
  ConstIterator it;
  QString ui_h;
  ConstIterator formit;
  QStringList dist_files;
  ConstIterator dlldir;
  QString target;
  QString destDir;
  QString orgDestDir;
  QStringBuilder<ProString,_ProString> *in_stack_fffffffffffff1b8;
  code *f;
  QMakeProject *in_stack_fffffffffffff1c0;
  QMakeProject *in_stack_fffffffffffff1c8;
  ProString *in_stack_fffffffffffff1d0;
  QMakeProject *in_stack_fffffffffffff1d8;
  MakefileGenerator *in_stack_fffffffffffff1e0;
  MakefileGenerator *in_stack_fffffffffffff1e8;
  ProStringList *in_stack_fffffffffffff1f0;
  MakefileGenerator *in_stack_fffffffffffff1f8;
  MakefileGenerator *in_stack_fffffffffffff200;
  QTextStream *in_stack_fffffffffffff208;
  undefined7 in_stack_fffffffffffff210;
  undefined1 in_stack_fffffffffffff217;
  undefined8 in_stack_fffffffffffff218;
  QFlagsStorage<MakefileGenerator::FileFixifyType> fix;
  undefined7 in_stack_fffffffffffff220;
  byte in_stack_fffffffffffff227;
  MakefileGenerator *in_stack_fffffffffffff228;
  long lVar10;
  undefined7 in_stack_fffffffffffff268;
  MakefileGenerator *in_stack_fffffffffffff270;
  byte local_d59;
  undefined1 noDummyQmakeAll;
  QChar local_c12 [13];
  undefined1 local_bf8 [24];
  const_iterator local_be0;
  QStringBuilder<const_ProString_&,_const_char_(&)[7]> local_bd8;
  const_iterator local_b98 [2];
  QTextStream *in_stack_fffffffffffff478;
  MakefileGenerator *in_stack_fffffffffffff480;
  undefined1 local_b00 [30];
  QChar local_ae2 [13];
  undefined1 local_ac8 [24];
  undefined1 local_ab0 [48];
  undefined1 local_a80 [56];
  QStringBuilder<const_ProString_&,_QString_&> local_a48;
  undefined8 local_a20;
  undefined8 local_a18;
  undefined8 local_a10;
  const_iterator local_a08 [13];
  undefined1 local_9a0 [48];
  undefined1 local_970 [140];
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_fffffffffffff71c;
  undefined1 local_878 [24];
  undefined1 local_860 [24];
  const_iterator local_848 [34];
  undefined1 local_738 [24];
  undefined1 local_720 [24];
  undefined1 local_708 [72];
  undefined1 local_6c0 [72];
  undefined1 local_678 [72];
  undefined1 local_630 [72];
  undefined1 local_5e8 [24];
  QStringBuilder<QString_&,_QString_&> local_5d0;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  QChar local_422;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined1 local_408 [48];
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined1 local_378 [96];
  undefined1 local_318 [28];
  uint local_2fc;
  undefined1 local_2f8 [24];
  QRegularExpression local_2e0 [8];
  undefined1 local_2d8 [48];
  QString local_2a8;
  undefined1 local_290 [72];
  undefined1 local_248 [48];
  undefined1 local_218 [24];
  undefined1 local_200 [48];
  undefined1 local_1d0 [144];
  undefined1 local_140 [144];
  undefined1 local_b0 [24];
  undefined1 local_98 [48];
  undefined1 local_68 [24];
  undefined1 local_50 [48];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MakefileGenerator::writeExportedVariables
            ((MakefileGenerator *)CONCAT17(in_stack_fffffffffffff217,in_stack_fffffffffffff210),
             in_stack_fffffffffffff208);
  QTextStream::operator<<(in_RSI,"####### Compiler, tools and options\n\n");
  pQVar4 = (QTextStream *)QTextStream::operator<<(in_RSI,"CC            = ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  (**(code **)(*in_RDI + 0xb0))(local_20,in_RDI,local_50);
  QTextStream::operator<<(pQVar4,(QString *)local_20);
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,
               (QTextStreamFunction)in_stack_fffffffffffff1b8);
  QString::~QString((QString *)0x2b5f4f);
  ProKey::~ProKey((ProKey *)0x2b5f5c);
  pQVar4 = (QTextStream *)QTextStream::operator<<(in_RSI,"CXX           = ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  (**(code **)(*in_RDI + 0xb0))(local_68,in_RDI,local_98);
  QTextStream::operator<<(pQVar4,(QString *)local_68);
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,
               (QTextStreamFunction)in_stack_fffffffffffff1b8);
  QString::~QString((QString *)0x2b5fde);
  ProKey::~ProKey((ProKey *)0x2b5feb);
  pQVar4 = (QTextStream *)QTextStream::operator<<(in_RSI,"DEFINES       = ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  QString::QString((QString *)in_stack_fffffffffffff1c8,(char *)in_stack_fffffffffffff1f8);
  QString::QString((QString *)in_stack_fffffffffffff1c8,(char *)in_stack_fffffffffffff1f8);
  QString::QString((QString *)in_stack_fffffffffffff1c8,(char *)in_stack_fffffffffffff1f8);
  MakefileGenerator::varGlue
            (in_stack_fffffffffffff1e8,(ProKey *)in_stack_fffffffffffff1e0,
             (QString *)in_stack_fffffffffffff1d8,&in_stack_fffffffffffff1d0->m_string,
             (QString *)in_stack_fffffffffffff1c8);
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)local_b0);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  QString::QString((QString *)in_stack_fffffffffffff1c8,(char *)in_stack_fffffffffffff1f8);
  QString::QString((QString *)in_stack_fffffffffffff1c8,(char *)in_stack_fffffffffffff1f8);
  QString::QString((QString *)in_stack_fffffffffffff1c8,(char *)in_stack_fffffffffffff1f8);
  MakefileGenerator::varGlue
            (in_stack_fffffffffffff1e8,(ProKey *)in_stack_fffffffffffff1e0,
             (QString *)in_stack_fffffffffffff1d8,&in_stack_fffffffffffff1d0->m_string,
             (QString *)in_stack_fffffffffffff1c8);
  QTextStream::operator<<(pQVar4,(QString *)local_140);
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,
               (QTextStreamFunction)in_stack_fffffffffffff1b8);
  QString::~QString((QString *)0x2b615f);
  QString::~QString((QString *)0x2b616c);
  QString::~QString((QString *)0x2b6179);
  QString::~QString((QString *)0x2b6186);
  ProKey::~ProKey((ProKey *)0x2b6193);
  QString::~QString((QString *)0x2b61a0);
  QString::~QString((QString *)0x2b61ad);
  QString::~QString((QString *)0x2b61ba);
  QString::~QString((QString *)0x2b61c7);
  ProKey::~ProKey((ProKey *)0x2b61d4);
  pQVar4 = (QTextStream *)QTextStream::operator<<(in_RSI,"CFLAGS        = ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  (**(code **)(*in_RDI + 0xb0))(local_1d0,in_RDI,local_200);
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)local_1d0);
  QTextStream::operator<<(pQVar4," $(DEFINES)\n");
  QString::~QString((QString *)0x2b6256);
  ProKey::~ProKey((ProKey *)0x2b6263);
  pQVar4 = (QTextStream *)QTextStream::operator<<(in_RSI,"CXXFLAGS      = ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  (**(code **)(*in_RDI + 0xb0))(local_218,in_RDI,local_248);
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)local_218);
  QTextStream::operator<<(pQVar4," $(DEFINES)\n");
  QString::~QString((QString *)0x2b62e5);
  ProKey::~ProKey((ProKey *)0x2b62f2);
  (**(code **)(*in_RDI + 0x118))(in_RDI,in_RSI);
  (**(code **)(*in_RDI + 0x120))(in_RDI,in_RSI);
  (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI);
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,
               (QTextStreamFunction)in_stack_fffffffffffff1b8);
  QTextStream::operator<<(in_RSI,"####### Output directory\n\n");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  QMakeProject::values(in_stack_fffffffffffff1c0,(ProKey *)in_stack_fffffffffffff1b8);
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x2b63aa);
  ProKey::~ProKey((ProKey *)0x2b63c0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    QTextStream::operator<<(in_RSI,"OBJECTS_DIR   = . \n");
  }
  else {
    pQVar4 = (QTextStream *)QTextStream::operator<<(in_RSI,"OBJECTS_DIR   = ");
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
    (**(code **)(*in_RDI + 0xb0))(&local_2a8,in_RDI,local_2d8);
    QString::QString((QString *)in_stack_fffffffffffff1c8,(char *)in_stack_fffffffffffff1f8);
    QFlags<QRegularExpression::PatternOption>::QFlags
              ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffff1c0,
               (PatternOption)((ulong)in_stack_fffffffffffff1b8 >> 0x20));
    QRegularExpression::QRegularExpression
              (local_2e0,(QString *)local_2f8,(QFlags_conflict *)(ulong)local_2fc);
    iVar3 = QString::remove(&local_2a8,(char *)local_2e0);
    (**(code **)(*in_RDI + 0x60))(local_290,in_RDI,iVar3);
    QTextStream::operator<<(pQVar4,(QString *)local_290);
    ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,
                 (QTextStreamFunction)in_stack_fffffffffffff1b8);
    QString::~QString((QString *)0x2b64bf);
    QRegularExpression::~QRegularExpression(local_2e0);
    QString::~QString((QString *)0x2b64d9);
    QString::~QString((QString *)0x2b64e6);
    ProKey::~ProKey((ProKey *)0x2b64f3);
  }
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,
               (QTextStreamFunction)in_stack_fffffffffffff1b8);
  QTextStream::operator<<(in_RSI,"####### Files\n\n");
  pQVar4 = (QTextStream *)QTextStream::operator<<(in_RSI,"SOURCES       = ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  QMakeProject::values(in_stack_fffffffffffff1c0,(ProKey *)in_stack_fffffffffffff1b8);
  MakefileGenerator::escapeFilePaths
            (in_stack_fffffffffffff1e0,(ProStringList *)in_stack_fffffffffffff1d8);
  MakefileGenerator::valList(in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0);
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)local_318);
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4," ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  QMakeProject::values(in_stack_fffffffffffff1c0,(ProKey *)in_stack_fffffffffffff1b8);
  MakefileGenerator::escapeFilePaths
            (in_stack_fffffffffffff1e0,(ProStringList *)in_stack_fffffffffffff1d8);
  MakefileGenerator::valList(in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0);
  QTextStream::operator<<(pQVar4,(QString *)local_378);
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,
               (QTextStreamFunction)in_stack_fffffffffffff1b8);
  QString::~QString((QString *)0x2b669a);
  ProStringList::~ProStringList((ProStringList *)0x2b66a7);
  ProKey::~ProKey((ProKey *)0x2b66b4);
  QString::~QString((QString *)0x2b66c1);
  ProStringList::~ProStringList((ProStringList *)0x2b66ce);
  ProKey::~ProKey((ProKey *)0x2b66db);
  local_3d8 = 0xaaaaaaaaaaaaaaaa;
  local_3d0 = 0xaaaaaaaaaaaaaaaa;
  local_3c8 = 0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  (**(code **)(*in_RDI + 0xb0))(&local_3d8,in_RDI,local_408);
  ProKey::~ProKey((ProKey *)0x2b674a);
  local_420 = 0xaaaaaaaaaaaaaaaa;
  local_418 = 0xaaaaaaaaaaaaaaaa;
  local_410 = 0xaaaaaaaaaaaaaaaa;
  Option::fixPathToTargetOS
            ((QString *)in_stack_fffffffffffff1d8,SUB81((ulong)in_stack_fffffffffffff1d0 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffff1d0 >> 0x30,0));
  bVar1 = QString::isEmpty((QString *)0x2b67a0);
  if (!bVar1) {
    QChar::QChar<char,_true>(&local_422,'/');
    uVar5 = QString::endsWith((QChar)(char16_t)&local_3d8,(uint)(ushort)local_422.ucs);
    if (((uVar5 & 1) != 0) ||
       (uVar5 = QString::endsWith((QString *)&local_3d8,0x3bdbd8), (uVar5 & 1) != 0)) {
      QString::operator+=((QString *)in_stack_fffffffffffff1c0,(QString *)in_stack_fffffffffffff1b8)
      ;
    }
  }
  local_440 = 0xaaaaaaaaaaaaaaaa;
  local_438 = 0xaaaaaaaaaaaaaaaa;
  local_430 = 0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  QMakeEvaluator::first
            (&in_stack_fffffffffffff1d8->super_QMakeEvaluator,(ProKey *)in_stack_fffffffffffff1d0);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  QMakeEvaluator::first
            (&in_stack_fffffffffffff1d8->super_QMakeEvaluator,(ProKey *)in_stack_fffffffffffff1d0);
  ::operator+((ProString *)in_stack_fffffffffffff1c8,(ProString *)in_stack_fffffffffffff1c0);
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff1b8);
  QStringBuilder<ProString,_ProString>::~QStringBuilder
            ((QStringBuilder<ProString,_ProString> *)in_stack_fffffffffffff1c0);
  ProString::~ProString((ProString *)0x2b6910);
  ProKey::~ProKey((ProKey *)0x2b691d);
  ProString::~ProString((ProString *)0x2b692a);
  ProKey::~ProKey((ProKey *)0x2b6937);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  pPVar6 = QMakeProject::values(in_stack_fffffffffffff1c0,(ProKey *)in_stack_fffffffffffff1b8);
  local_5d0 = ::operator+((QString *)in_stack_fffffffffffff1c0,(QString *)in_stack_fffffffffffff1b8)
  ;
  ProString::ProString<QString&,QString&>
            (in_stack_fffffffffffff1d0,
             (QStringBuilder<QString_&,_QString_&> *)in_stack_fffffffffffff1c8);
  QList<ProString>::prepend
            ((QList<ProString> *)in_stack_fffffffffffff1c0,&in_stack_fffffffffffff1b8->a);
  ProString::~ProString((ProString *)0x2b69db);
  ProKey::~ProKey((ProKey *)0x2b69e8);
  (**(code **)(*in_RDI + 0x128))(in_RDI,in_RSI);
  MakefileGenerator::writeExtraCompilerVariables
            (in_stack_fffffffffffff228,
             (QTextStream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
  MakefileGenerator::writeExtraVariables
            (in_stack_fffffffffffff200,(QTextStream *)in_stack_fffffffffffff1f8);
  pQVar4 = (QTextStream *)QTextStream::operator<<(in_RSI,"DIST          = ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  MakefileGenerator::fileVarList
            ((MakefileGenerator *)in_stack_fffffffffffff1d8,(ProKey *)in_stack_fffffffffffff1d0);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)local_5e8);
  pMVar8 = (MakefileGenerator *)QTextStream::operator<<(pQVar7,' ');
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  MakefileGenerator::fileVarList
            ((MakefileGenerator *)in_stack_fffffffffffff1d8,(ProKey *)in_stack_fffffffffffff1d0);
  pQVar7 = (QTextStream *)QTextStream::operator<<((QTextStream *)pMVar8,(QString *)local_630);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,' ');
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  MakefileGenerator::fileVarList
            ((MakefileGenerator *)in_stack_fffffffffffff1d8,(ProKey *)in_stack_fffffffffffff1d0);
  QTextStream::operator<<(pQVar7,(QString *)local_678);
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,
               (QTextStreamFunction)in_stack_fffffffffffff1b8);
  QString::~QString((QString *)0x2b6b5f);
  ProKey::~ProKey((ProKey *)0x2b6b6c);
  QString::~QString((QString *)0x2b6b79);
  ProKey::~ProKey((ProKey *)0x2b6b86);
  QString::~QString((QString *)0x2b6b93);
  ProKey::~ProKey((ProKey *)0x2b6ba0);
  pQVar7 = (QTextStream *)QTextStream::operator<<(in_RSI,"QMAKE_TARGET  = ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  MakefileGenerator::fileVar
            ((MakefileGenerator *)in_stack_fffffffffffff1d8,(ProKey *)in_stack_fffffffffffff1d0);
  QTextStream::operator<<(pQVar7,(QString *)local_6c0);
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,
               (QTextStreamFunction)in_stack_fffffffffffff1b8);
  QString::~QString((QString *)0x2b6c1e);
  ProKey::~ProKey((ProKey *)0x2b6c2b);
  pQVar7 = (QTextStream *)QTextStream::operator<<(in_RSI,"DESTDIR        = ");
  (**(code **)(*in_RDI + 0x60))(local_708,in_RDI,&local_420);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)local_708);
  QTextStream::operator<<(pQVar7," #avoid trailing-slash linebreak\n");
  QString::~QString((QString *)0x2b6c96);
  pQVar7 = (QTextStream *)QTextStream::operator<<(in_RSI,"TARGET         = ");
  (**(code **)(*in_RDI + 0x60))(local_720,in_RDI,&local_440);
  QTextStream::operator<<(pQVar7,(QString *)local_720);
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,
               (QTextStreamFunction)in_stack_fffffffffffff1b8);
  QString::~QString((QString *)0x2b6d01);
  pQVar7 = (QTextStream *)QTextStream::operator<<(in_RSI,"DESTDIR_TARGET = ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  MakefileGenerator::fileVar
            ((MakefileGenerator *)in_stack_fffffffffffff1d8,(ProKey *)in_stack_fffffffffffff1d0);
  QTextStream::operator<<(pQVar7,(QString *)local_738);
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,
               (QTextStreamFunction)in_stack_fffffffffffff1b8);
  QString::~QString((QString *)0x2b6d7f);
  ProKey::~ProKey((ProKey *)0x2b6d8c);
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,
               (QTextStreamFunction)in_stack_fffffffffffff1b8);
  (**(code **)(*in_RDI + 0x130))(in_RDI,in_RSI);
  QTextStream::operator<<(in_RSI,"####### Build rules\n\n");
  (**(code **)(*in_RDI + 0x138))(in_RDI,in_RSI);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  QMakeEvaluator::first
            (&in_stack_fffffffffffff1d8->super_QMakeEvaluator,(ProKey *)in_stack_fffffffffffff1d0);
  bVar1 = ProString::operator!=
                    ((ProString *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  ProString::~ProString((ProString *)0x2b6e56);
  ProKey::~ProKey((ProKey *)0x2b6e63);
  fix.i = (Int)((ulong)in_stack_fffffffffffff218 >> 0x20);
  noDummyQmakeAll = (undefined1)((ulong)pPVar6 >> 0x38);
  if (bVar1) {
    QString::QString((QString *)in_stack_fffffffffffff1c8,(char *)in_stack_fffffffffffff1f8);
    bVar1 = QMakeProject::isActiveConfig
                      (in_stack_fffffffffffff1c8,(QString *)in_stack_fffffffffffff1c0,
                       SUB81((ulong)in_stack_fffffffffffff1b8 >> 0x38,0));
    local_d59 = 0;
    if (bVar1) {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
      QMakeProject::values(in_stack_fffffffffffff1c0,(ProKey *)in_stack_fffffffffffff1b8);
      bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x2b6f1f);
      local_d59 = bVar1 ^ 0xff;
      ProKey::~ProKey((ProKey *)0x2b6f4f);
    }
    QString::~QString((QString *)0x2b6f5c);
    fix.i = (Int)((ulong)in_stack_fffffffffffff218 >> 0x20);
    noDummyQmakeAll = (undefined1)((ulong)pPVar6 >> 0x38);
    if ((local_d59 & 1) != 0) {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
      QMakeProject::values(in_stack_fffffffffffff1c0,(ProKey *)in_stack_fffffffffffff1b8);
      ProKey::~ProKey((ProKey *)0x2b6fd3);
      local_848[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_848[0] = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff1c0);
      while( true ) {
        cVar9 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff1c0);
        bVar1 = QList<ProString>::const_iterator::operator!=(local_848,cVar9);
        fix.i = (Int)((ulong)in_stack_fffffffffffff218 >> 0x20);
        noDummyQmakeAll = (undefined1)((ulong)pPVar6 >> 0x38);
        if (!bVar1) break;
        in_stack_fffffffffffff270 =
             (MakefileGenerator *)
             QTextStream::operator<<(in_RSI,"\t-$(COPY_FILE) $(DESTDIR_TARGET) ");
        QList<ProString>::const_iterator::operator*(local_848);
        ProString::toQString(&in_stack_fffffffffffff1b8->a);
        Option::fixPathToTargetOS
                  ((QString *)in_stack_fffffffffffff1d8,
                   SUB81((ulong)in_stack_fffffffffffff1d0 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffff1d0 >> 0x30,0));
        (**(code **)(*in_RDI + 0x60))(local_860,in_RDI,local_878);
        QTextStream::operator<<((QTextStream *)in_stack_fffffffffffff270,(QString *)local_860);
        ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,
                     (QTextStreamFunction)in_stack_fffffffffffff1b8);
        QString::~QString((QString *)0x2b70de);
        QString::~QString((QString *)0x2b70eb);
        QString::~QString((QString *)0x2b70f8);
        QList<ProString>::const_iterator::operator++(local_848);
      }
    }
    ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,
                 (QTextStreamFunction)in_stack_fffffffffffff1b8);
    (**(code **)(*in_RDI + 0x140))(in_RDI,in_RSI);
  }
  MakefileGenerator::writeMakeQmake(pMVar8,pQVar4,(bool)noDummyQmakeAll);
  QFlags<MakefileGenerator::FileFixifyType>::QFlags
            ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffff1c0,
             (FileFixifyType)((ulong)in_stack_fffffffffffff1b8 >> 0x20));
  MakefileGenerator::fileFixify
            (in_stack_fffffffffffff1e0,(QStringList *)in_stack_fffffffffffff1d8,
             (FileFixifyTypes)fix.i,SUB81((ulong)in_stack_fffffffffffff1d0 >> 0x38,0));
  lVar10 = in_RDI[0x1b];
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff1d8,(ProKey *)in_stack_fffffffffffff1d0);
  bVar2 = bVar1 ^ 0xff;
  ProKey::~ProKey((ProKey *)0x2b720b);
  if ((bVar2 & 1) != 0) {
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
    QMakeProject::values(in_stack_fffffffffffff1c0,(ProKey *)in_stack_fffffffffffff1b8);
    ProStringList::toQStringList((ProStringList *)in_stack_fffffffffffff1e0);
    QList<QString>::operator+=
              ((QList<QString> *)in_stack_fffffffffffff1c0,
               (QList<QString> *)in_stack_fffffffffffff1b8);
    QList<QString>::~QList((QList<QString> *)0x2b728a);
    ProKey::~ProKey((ProKey *)0x2b7297);
  }
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff1d8,(ProKey *)in_stack_fffffffffffff1d0);
  ProKey::~ProKey((ProKey *)0x2b72ed);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
    (**(code **)(*in_RDI + 0xb0))(local_970,in_RDI,local_9a0);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff1c0,(rvalue_ref)in_stack_fffffffffffff1b8);
    QString::~QString((QString *)0x2b7351);
    ProKey::~ProKey((ProKey *)0x2b735e);
  }
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff1d8,(ProKey *)in_stack_fffffffffffff1d0);
  ProKey::~ProKey((ProKey *)0x2b73b4);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_fffffffffffff228 = (MakefileGenerator *)in_RDI[0x1b];
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
    QMakeProject::values(in_stack_fffffffffffff1c0,(ProKey *)in_stack_fffffffffffff1b8);
    ProKey::~ProKey((ProKey *)0x2b7422);
    local_a08[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_a08[0] = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff1c0);
    while( true ) {
      cVar9 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff1c0);
      bVar1 = QList<ProString>::const_iterator::operator!=(local_a08,cVar9);
      if (!bVar1) break;
      local_a20 = 0xaaaaaaaaaaaaaaaa;
      local_a18 = 0xaaaaaaaaaaaaaaaa;
      local_a10 = 0xaaaaaaaaaaaaaaaa;
      QList<ProString>::const_iterator::operator*(local_a08);
      QList<QString>::first((QList<QString> *)in_stack_fffffffffffff1c0);
      local_a48 = ::operator+((ProString *)in_stack_fffffffffffff1c0,
                              (QString *)in_stack_fffffffffffff1b8);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<const_ProString_&,_QString_&> *)in_stack_fffffffffffff1b8);
      QFlags<MakefileGenerator::FileFixifyType>::QFlags
                ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffff1c0,
                 (FileFixifyType)((ulong)in_stack_fffffffffffff1b8 >> 0x20));
      MakefileGenerator::fileFixify
                (in_stack_fffffffffffff270,(QString *)CONCAT17(bVar2,in_stack_fffffffffffff268),
                 (FileFixifyTypes)in_stack_fffffffffffff71c.i,SUB81((ulong)lVar10 >> 0x38,0));
      QString::~QString((QString *)0x2b7549);
      QString::QString((QString *)in_stack_fffffffffffff1c0,(QString *)in_stack_fffffffffffff1b8);
      in_stack_fffffffffffff227 =
           MakefileGenerator::exists
                     ((MakefileGenerator *)in_stack_fffffffffffff1d8,
                      &in_stack_fffffffffffff1d0->m_string);
      QString::~QString((QString *)0x2b7584);
      if ((in_stack_fffffffffffff227 & 1) != 0) {
        QList<QString>::operator<<
                  ((QList<QString> *)in_stack_fffffffffffff1c0,
                   (parameter_type)in_stack_fffffffffffff1b8);
      }
      QString::~QString((QString *)0x2b75b0);
      QList<ProString>::const_iterator::operator++(local_a08);
    }
  }
  pQVar4 = (QTextStream *)QTextStream::operator<<(in_RSI,"dist:\n\t");
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,"$(ZIP) ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  (**(code **)(*in_RDI + 0xb0))(local_a80,in_RDI,local_ab0);
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)local_a80);
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,".zip $(SOURCES) $(DIST) ");
  MakefileGenerator::escapeFilePaths
            (in_stack_fffffffffffff1e8,(QStringList *)in_stack_fffffffffffff1e0);
  QChar::QChar<char,_true>(local_ae2,' ');
  QListSpecialMethods<QString>::join
            ((QListSpecialMethods<QString> *)in_stack_fffffffffffff1c8,
             (QChar)(char16_t)((ulong)in_stack_fffffffffffff1d8 >> 0x30));
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)local_ac8);
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,' ');
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  MakefileGenerator::fileVar
            ((MakefileGenerator *)in_stack_fffffffffffff1d8,(ProKey *)in_stack_fffffffffffff1d0);
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)local_b00);
  QTextStream::operator<<(pQVar4,' ');
  QString::~QString((QString *)0x2b7714);
  ProKey::~ProKey((ProKey *)0x2b7721);
  QString::~QString((QString *)0x2b772e);
  QList<QString>::~QList((QList<QString> *)0x2b773b);
  QString::~QString((QString *)0x2b7748);
  ProKey::~ProKey((ProKey *)0x2b7755);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
  bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff1d8,(ProKey *)in_stack_fffffffffffff1d0);
  bVar2 = bVar1 ^ 0xff;
  ProKey::~ProKey((ProKey *)0x2b77a2);
  if ((bVar2 & 1) != 0) {
    pMVar8 = (MakefileGenerator *)in_RDI[0x1b];
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff1c0,(char *)in_stack_fffffffffffff1b8);
    QMakeProject::values(in_stack_fffffffffffff1c0,(ProKey *)in_stack_fffffffffffff1b8);
    ProKey::~ProKey((ProKey *)0x2b780d);
    local_b98[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_b98[0] = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff1c0);
    while( true ) {
      cVar9 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff1c0);
      bVar1 = QList<ProString>::const_iterator::operator!=(local_b98,cVar9);
      if (!bVar1) break;
      QList<ProString>::const_iterator::operator*(local_b98);
      local_bd8 = ::operator+((ProString *)in_stack_fffffffffffff1c0,
                              (char (*) [7])in_stack_fffffffffffff1b8);
      ProKey::ProKey<ProString_const&,char_const(&)[7]>
                ((ProKey *)in_stack_fffffffffffff1c0,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)in_stack_fffffffffffff1b8);
      pPVar6 = QMakeProject::values(in_stack_fffffffffffff1c0,(ProKey *)in_stack_fffffffffffff1b8);
      ProKey::~ProKey((ProKey *)0x2b78fc);
      local_be0.i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_be0 = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff1c0);
      while( true ) {
        cVar9 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff1c0);
        bVar1 = QList<ProString>::const_iterator::operator!=(&local_be0,cVar9);
        if (!bVar1) break;
        in_stack_fffffffffffff1c0 = (QMakeProject *)in_RDI[0x1b];
        QList<ProString>::const_iterator::operator*(&local_be0);
        QMakeProject::values(in_stack_fffffffffffff1c0,(ProKey *)in_stack_fffffffffffff1b8);
        pQVar4 = in_RSI;
        MakefileGenerator::escapeFilePaths(pMVar8,pPVar6);
        QChar::QChar<char,_true>(local_c12,' ');
        ProStringList::join((ProStringList *)in_stack_fffffffffffff1b8,
                            (QChar)(char16_t)((ulong)pQVar4 >> 0x30));
        pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)local_bf8);
        QTextStream::operator<<(pQVar4,' ');
        QString::~QString((QString *)0x2b7a3a);
        ProStringList::~ProStringList((ProStringList *)0x2b7a47);
        QList<ProString>::const_iterator::operator++(&local_be0);
      }
      QList<ProString>::const_iterator::operator++(local_b98);
    }
  }
  f = Qt::endl;
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,Qt::endl);
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,f);
  (**(code **)(*in_RDI + 0x108))(in_RDI,in_RSI);
  MakefileGenerator::writeExtraTargets
            (in_stack_fffffffffffff228,
             (QTextStream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
  MakefileGenerator::writeExtraCompilerTargets(in_stack_fffffffffffff480,in_stack_fffffffffffff478);
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,f);
  ::operator<<((QTextStream *)in_stack_fffffffffffff1c0,f);
  QList<QString>::~QList((QList<QString> *)0x2b7b03);
  QString::~QString((QString *)0x2b7b10);
  QString::~QString((QString *)0x2b7b1d);
  QString::~QString((QString *)0x2b7b2a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::writeStandardParts(QTextStream &t)
{
    writeExportedVariables(t);

    t << "####### Compiler, tools and options\n\n";
    t << "CC            = " << var("QMAKE_CC") << Qt::endl;
    t << "CXX           = " << var("QMAKE_CXX") << Qt::endl;
    t << "DEFINES       = "
      << varGlue("PRL_EXPORT_DEFINES","-D"," -D"," ")
      << varGlue("DEFINES","-D"," -D","") << Qt::endl;
    t << "CFLAGS        = " << var("QMAKE_CFLAGS") << " $(DEFINES)\n";
    t << "CXXFLAGS      = " << var("QMAKE_CXXFLAGS") << " $(DEFINES)\n";

    writeIncPart(t);
    writeLibsPart(t);
    writeDefaultVariables(t);
    t << Qt::endl;

    t << "####### Output directory\n\n";
    if(!project->values("OBJECTS_DIR").isEmpty())
        t << "OBJECTS_DIR   = " << escapeFilePath(var("OBJECTS_DIR").remove(QRegularExpression("\\\\$"))) << Qt::endl;
    else
        t << "OBJECTS_DIR   = . \n";
    t << Qt::endl;

    t << "####### Files\n\n";
    t << "SOURCES       = " << valList(escapeFilePaths(project->values("SOURCES")))
      << " " << valList(escapeFilePaths(project->values("GENERATED_SOURCES"))) << Qt::endl;

    // do this here so we can set DEST_TARGET to be the complete path to the final target if it is needed.
    QString orgDestDir = var("DESTDIR");
    QString destDir = Option::fixPathToTargetOS(orgDestDir, false);
    if (!destDir.isEmpty() && (orgDestDir.endsWith('/') || orgDestDir.endsWith(Option::dir_sep)))
        destDir += Option::dir_sep;
    QString target = QString(project->first("TARGET")+project->first("TARGET_EXT"));
    project->values("DEST_TARGET").prepend(destDir + target);

    writeObjectsPart(t);

    writeExtraCompilerVariables(t);
    writeExtraVariables(t);

    t << "DIST          = " << fileVarList("DISTFILES") << ' '
      << fileVarList("HEADERS") << ' ' << fileVarList("SOURCES") << Qt::endl;
    t << "QMAKE_TARGET  = " << fileVar("QMAKE_ORIG_TARGET") << Qt::endl;  // unused
    // The comment is important to maintain variable compatibility with Unix
    // Makefiles, while not interpreting a trailing-slash as a linebreak
    t << "DESTDIR        = " << escapeFilePath(destDir) << " #avoid trailing-slash linebreak\n";
    t << "TARGET         = " << escapeFilePath(target) << Qt::endl;
    t << "DESTDIR_TARGET = " << fileVar("DEST_TARGET") << Qt::endl;
    t << Qt::endl;

    writeImplicitRulesPart(t);

    t << "####### Build rules\n\n";
    writeBuildRulesPart(t);

    if (project->first("TEMPLATE") != "aux") {
        if (project->isActiveConfig("shared") && !project->values("DLLDESTDIR").isEmpty()) {
            const ProStringList &dlldirs = project->values("DLLDESTDIR");
            for (ProStringList::ConstIterator dlldir = dlldirs.begin(); dlldir != dlldirs.end(); ++dlldir) {
                t << "\t-$(COPY_FILE) $(DESTDIR_TARGET) "
                  << escapeFilePath(Option::fixPathToTargetOS((*dlldir).toQString(), false)) << Qt::endl;
            }
        }
        t << Qt::endl;

        writeRcFilePart(t);
    }

    writeMakeQmake(t);

    QStringList dist_files = fileFixify(Option::mkfile::project_files);
    if(!project->isEmpty("QMAKE_INTERNAL_INCLUDED_FILES"))
        dist_files += project->values("QMAKE_INTERNAL_INCLUDED_FILES").toQStringList();
    if(!project->isEmpty("TRANSLATIONS"))
        dist_files << var("TRANSLATIONS");
    if(!project->isEmpty("FORMS")) {
        const ProStringList &forms = project->values("FORMS");
        for (ProStringList::ConstIterator formit = forms.begin(); formit != forms.end(); ++formit) {
            QString ui_h = fileFixify((*formit) + Option::h_ext.first());
            if(exists(ui_h))
                dist_files << ui_h;
        }
    }
    t << "dist:\n\t"
      << "$(ZIP) " << var("QMAKE_ORIG_TARGET") << ".zip $(SOURCES) $(DIST) "
      << escapeFilePaths(dist_files).join(' ') << ' ' << fileVar("TRANSLATIONS") << ' ';
    if(!project->isEmpty("QMAKE_EXTRA_COMPILERS")) {
        const ProStringList &quc = project->values("QMAKE_EXTRA_COMPILERS");
        for (ProStringList::ConstIterator it = quc.begin(); it != quc.end(); ++it) {
            const ProStringList &inputs = project->values(ProKey(*it + ".input"));
            for (ProStringList::ConstIterator input = inputs.begin(); input != inputs.end(); ++input) {
                const ProStringList &val = project->values((*input).toKey());
                t << escapeFilePaths(val).join(' ') << ' ';
            }
        }
    }
    t << Qt::endl << Qt::endl;

    writeCleanParts(t);
    writeExtraTargets(t);
    writeExtraCompilerTargets(t);
    t << Qt::endl << Qt::endl;
}